

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O3

int Sfm_TimSortArrayByArrival(Sfm_Tim_t *p,Vec_Int_t *vNodes,int iPivot)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  word wVar6;
  uint uVar7;
  word *pwVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  
  if (iPivot < 0) {
LAB_004c5df0:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10b,"int Abc_Var2Lit(int, int)");
  }
  uVar7 = iPivot * 2;
  uVar1 = (p->vTimArrs).nSize;
  if (uVar1 == uVar7 || SBORROW4(uVar1,uVar7) != (int)(uVar1 + iPivot * -2) < 0) {
LAB_004c5e0f:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar5 = (p->vTimArrs).pArray;
  iVar11 = piVar5[uVar7];
  iVar2 = piVar5[(ulong)uVar7 + 1];
  if (iVar2 < iVar11) {
    iVar2 = iVar11;
  }
  if (p->DeltaCrit < 1) {
    __assert_fail("p->DeltaCrit > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmTim.c"
                  ,0x155,"int Sfm_TimSortArrayByArrival(Sfm_Tim_t *, Vec_Int_t *, int)");
  }
  (p->vSortData).nSize = 0;
  if (vNodes->nSize < 1) {
    pwVar8 = (p->vSortData).pArray;
    iVar11 = 0;
  }
  else {
    iVar11 = 0;
    lVar10 = 0;
    do {
      uVar1 = vNodes->pArray[lVar10];
      uVar9 = (ulong)uVar1;
      if ((int)uVar1 < 0) goto LAB_004c5df0;
      if ((p->vTimArrs).nSize <= (int)(uVar1 * 2)) goto LAB_004c5e0f;
      piVar5 = (p->vTimArrs).pArray;
      iVar3 = piVar5[uVar9 * 2];
      iVar4 = piVar5[uVar9 * 2 + 1];
      if (iVar4 < iVar3) {
        iVar4 = iVar3;
      }
      if (iVar11 == (p->vSortData).nCap) {
        if (iVar11 < 0x10) {
          pwVar8 = (p->vSortData).pArray;
          if (pwVar8 == (word *)0x0) {
            pwVar8 = (word *)malloc(0x80);
          }
          else {
            pwVar8 = (word *)realloc(pwVar8,0x80);
          }
          (p->vSortData).pArray = pwVar8;
          if (pwVar8 == (word *)0x0) {
LAB_004c5e2e:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                          ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          (p->vSortData).nCap = 0x10;
        }
        else {
          pwVar8 = (p->vSortData).pArray;
          __size = (ulong)(uint)(iVar11 * 2) * 8;
          if (pwVar8 == (word *)0x0) {
            pwVar8 = (word *)malloc(__size);
          }
          else {
            pwVar8 = (word *)realloc(pwVar8,__size);
          }
          (p->vSortData).pArray = pwVar8;
          if (pwVar8 == (word *)0x0) goto LAB_004c5e2e;
          (p->vSortData).nCap = iVar11 * 2;
        }
      }
      else {
        pwVar8 = (p->vSortData).pArray;
      }
      iVar3 = (p->vSortData).nSize;
      iVar11 = iVar3 + 1;
      (p->vSortData).nSize = iVar11;
      pwVar8[iVar3] = (long)iVar4 | uVar9 << 0x20;
      lVar10 = lVar10 + 1;
    } while (lVar10 < vNodes->nSize);
  }
  Abc_QuickSort3(pwVar8,iVar11,0);
  vNodes->nSize = 0;
  if ((p->vSortData).nSize < 1) {
    iVar11 = -1;
  }
  else {
    iVar11 = -1;
    lVar10 = 0;
    do {
      wVar6 = (p->vSortData).pArray[lVar10];
      Vec_IntPush(vNodes,(int)(wVar6 >> 0x20));
      if (iVar11 == -1) {
        iVar11 = -1;
        if (iVar2 < (int)wVar6 + p->DeltaCrit) {
          iVar11 = (int)lVar10;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vSortData).nSize);
  }
  return iVar11;
}

Assistant:

int Sfm_TimSortArrayByArrival( Sfm_Tim_t * p, Vec_Int_t * vNodes, int iPivot )
{
    word Entry; 
    int i, Id, nDivNew = -1; 
    int MaxDelay = Sfm_TimArrMaxId(p, iPivot);
    assert( p->DeltaCrit > 0 );
    // collect nodes
    Vec_WrdClear( &p->vSortData );
    Vec_IntForEachEntry( vNodes, Id, i )
        Vec_WrdPush( &p->vSortData, ((word)Id << 32) | Sfm_TimArrMaxId(p, Id) );
    // sort nodes by delay
    Abc_QuickSort3( Vec_WrdArray(&p->vSortData), Vec_WrdSize(&p->vSortData), 0 );
    // collect sorted nodes and find place where divisors end
    Vec_IntClear( vNodes );
    Vec_WrdForEachEntry( &p->vSortData, Entry, i )
    {
        Vec_IntPush( vNodes, (int)(Entry >> 32) );
        if ( nDivNew == -1 && ((int)Entry) + p->DeltaCrit > MaxDelay )
            nDivNew = i;
    }
    return nDivNew;
}